

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int checkEquivalence(Abc_Ntk_t *pNtk1,Vec_Int_t *matchedInputs1,Vec_Int_t *matchedOutputs1,
                    Abc_Ntk_t *pNtk2,Vec_Int_t *matchedInputs2,Vec_Int_t *matchedOutputs2)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *iMatchPairs;
  void **ppvVar3;
  Vec_Ptr_t *oMatchPairs;
  char *__s;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  iVar2 = pNtk1->vPis->nSize;
  uVar11 = (ulong)(uint)(iVar2 * 2);
  iMatchPairs = (Vec_Ptr_t *)malloc(0x10);
  if (iVar2 * 2 - 1U < 7) {
    uVar11 = 8;
  }
  iMatchPairs->nSize = 0;
  iVar10 = (int)uVar11;
  iMatchPairs->nCap = iVar10;
  if (iVar10 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar10 << 3);
  }
  iMatchPairs->pArray = ppvVar3;
  iVar10 = pNtk1->vPos->nSize;
  uVar9 = (ulong)(uint)(iVar10 * 2);
  oMatchPairs = (Vec_Ptr_t *)malloc(0x10);
  if (iVar10 * 2 - 1U < 7) {
    uVar9 = 8;
  }
  oMatchPairs->nSize = 0;
  iVar7 = (int)uVar9;
  oMatchPairs->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar7 << 3);
  }
  oMatchPairs->pArray = ppvVar3;
  if (0 < iVar2) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (matchedInputs2->nSize <= lVar6) goto LAB_0029b57b;
      iVar2 = *(int *)((long)matchedInputs2->pArray + lVar5 * 2);
      if (((long)iVar2 < 0) || (pNtk2->vPis->nSize <= iVar2)) goto LAB_0029b55c;
      pvVar1 = pNtk2->vPis->pArray[iVar2];
      uVar4 = (uint)lVar5;
      uVar8 = (uint)uVar11;
      if (uVar4 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(iMatchPairs->pArray,0x80);
          }
          iMatchPairs->pArray = ppvVar3;
          iMatchPairs->nCap = 0x10;
          uVar11 = 0x10;
        }
        else {
          uVar11 = (ulong)(uVar8 * 2);
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar11 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(iMatchPairs->pArray,uVar11 * 8);
          }
          iMatchPairs->pArray = ppvVar3;
          iMatchPairs->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar3 = iMatchPairs->pArray;
      }
      ppvVar3[lVar5] = pvVar1;
      if (matchedInputs1->nSize <= lVar6) goto LAB_0029b57b;
      iVar2 = *(int *)((long)matchedInputs1->pArray + lVar5 * 2);
      if (((long)iVar2 < 0) || (pNtk1->vPis->nSize <= iVar2)) goto LAB_0029b55c;
      pvVar1 = pNtk1->vPis->pArray[iVar2];
      if (uVar4 + 1 == (int)uVar11) {
        if (uVar4 < 0xf) {
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(iMatchPairs->pArray,0x80);
          }
          iMatchPairs->pArray = ppvVar3;
          iMatchPairs->nCap = 0x10;
          uVar11 = 0x10;
        }
        else {
          uVar4 = (int)uVar11 * 2;
          uVar11 = (ulong)uVar4;
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar11 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(iMatchPairs->pArray,uVar11 * 8);
          }
          iMatchPairs->pArray = ppvVar3;
          iMatchPairs->nCap = uVar4;
        }
      }
      else {
        ppvVar3 = iMatchPairs->pArray;
      }
      iMatchPairs->nSize = (int)(lVar5 + 2);
      ppvVar3[lVar5 + 1] = pvVar1;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 2;
    } while (lVar6 < pNtk1->vPis->nSize);
    iVar10 = pNtk1->vPos->nSize;
  }
  if (0 < iVar10) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      if (matchedOutputs2->nSize <= lVar6) {
LAB_0029b57b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = *(int *)((long)matchedOutputs2->pArray + lVar5 * 2);
      if (((long)iVar2 < 0) || (pNtk2->vPos->nSize <= iVar2)) {
LAB_0029b55c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pNtk2->vPos->pArray[iVar2];
      uVar4 = (uint)lVar5;
      uVar8 = (uint)uVar9;
      if (uVar4 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(oMatchPairs->pArray,0x80);
          }
          oMatchPairs->pArray = ppvVar3;
          oMatchPairs->nCap = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar9 = (ulong)(uVar8 * 2);
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar9 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(oMatchPairs->pArray,uVar9 * 8);
          }
          oMatchPairs->pArray = ppvVar3;
          oMatchPairs->nCap = uVar8 * 2;
        }
      }
      else {
        ppvVar3 = oMatchPairs->pArray;
      }
      ppvVar3[lVar5] = pvVar1;
      if (matchedOutputs1->nSize <= lVar6) goto LAB_0029b57b;
      iVar2 = *(int *)((long)matchedOutputs1->pArray + lVar5 * 2);
      if (((long)iVar2 < 0) || (pNtk1->vPos->nSize <= iVar2)) goto LAB_0029b55c;
      pvVar1 = pNtk1->vPos->pArray[iVar2];
      if (uVar4 + 1 == (int)uVar9) {
        if (uVar4 < 0xf) {
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(oMatchPairs->pArray,0x80);
          }
          oMatchPairs->pArray = ppvVar3;
          oMatchPairs->nCap = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar4 = (int)uVar9 * 2;
          uVar9 = (ulong)uVar4;
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar9 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(oMatchPairs->pArray,uVar9 * 8);
          }
          oMatchPairs->pArray = ppvVar3;
          oMatchPairs->nCap = uVar4;
        }
      }
      else {
        ppvVar3 = oMatchPairs->pArray;
      }
      oMatchPairs->nSize = (int)(lVar5 + 2);
      ppvVar3[lVar5 + 1] = pvVar1;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 2;
    } while (lVar6 < pNtk1->vPos->nSize);
  }
  iVar2 = Abc_NtkBmSat(pNtk1,pNtk2,iMatchPairs,oMatchPairs,(Vec_Int_t *)0x0,0);
  __s = "*** Circuits are equivalent ***";
  if (iVar2 == 0) {
    __s = "*** Circuits are NOT equivalent ***";
  }
  puts(__s);
  if (iMatchPairs->pArray != (void **)0x0) {
    free(iMatchPairs->pArray);
  }
  free(iMatchPairs);
  if (oMatchPairs->pArray != (void **)0x0) {
    free(oMatchPairs->pArray);
  }
  free(oMatchPairs);
  return iVar2;
}

Assistant:

int checkEquivalence( Abc_Ntk_t * pNtk1, Vec_Int_t* matchedInputs1, Vec_Int_t * matchedOutputs1,
                       Abc_Ntk_t * pNtk2, Vec_Int_t* matchedInputs2, Vec_Int_t * matchedOutputs2)
{    
    Vec_Ptr_t * iMatchPairs, * oMatchPairs;
    int i;
    int result;

    iMatchPairs = Vec_PtrAlloc( Abc_NtkPiNum( pNtk1 ) * 2);
    oMatchPairs = Vec_PtrAlloc( Abc_NtkPoNum( pNtk1 ) * 2);

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {    
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i)));
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i)));
    }
                

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)        
    {
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i)));
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i)));
    }        

    result = Abc_NtkBmSat(pNtk1, pNtk2, iMatchPairs, oMatchPairs, NULL, 0);

    if( result )
        printf("*** Circuits are equivalent ***\n");
    else
        printf("*** Circuits are NOT equivalent ***\n");

    Vec_PtrFree( iMatchPairs );
    Vec_PtrFree( oMatchPairs );    

    return result;
}